

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l1x.cpp
# Opt level: O1

void __thiscall VL53L1X::readResults(VL53L1X *this)

{
  I2Cgeneric *pIVar1;
  uint8_t buffer [1];
  uint8_t buffer_1 [1];
  uint16_t buffer_2;
  uint16_t buffer_3;
  uint16_t buffer_4;
  uint16_t buffer_5;
  uint8_t local_1a;
  uint8_t local_19;
  uint16_t local_18;
  uint16_t local_16;
  uint16_t local_14;
  uint16_t local_12;
  
  pIVar1 = (this->super_VL53LXX).i2c;
  (*pIVar1->_vptr_I2Cgeneric[0x10])(pIVar1,0x89,&local_1a,0);
  (this->results).range_status = local_1a;
  pIVar1 = (this->super_VL53LXX).i2c;
  (*pIVar1->_vptr_I2Cgeneric[0x10])(pIVar1,0x8b,&local_19,0);
  (this->results).stream_count = local_19;
  pIVar1 = (this->super_VL53LXX).i2c;
  (*pIVar1->_vptr_I2Cgeneric[0x11])(pIVar1,0x8c,&local_18,0);
  (this->results).dss_actual_effective_spads_sd0 = local_18;
  pIVar1 = (this->super_VL53LXX).i2c;
  (*pIVar1->_vptr_I2Cgeneric[0x11])(pIVar1,0x90,&local_16,0);
  (this->results).ambient_count_rate_mcps_sd0 = local_16;
  pIVar1 = (this->super_VL53LXX).i2c;
  (*pIVar1->_vptr_I2Cgeneric[0x11])(pIVar1,0x96,&local_14,0);
  (this->results).final_crosstalk_corrected_range_mm_sd0 = local_14;
  pIVar1 = (this->super_VL53LXX).i2c;
  (*pIVar1->_vptr_I2Cgeneric[0x11])(pIVar1,0x98,&local_12,0);
  (this->results).peak_signal_count_rate_crosstalk_corrected_mcps_sd0 = local_12;
  return;
}

Assistant:

void VL53L1X::readResults()
{
  results.range_status = this->readReg(VL53L1X_DEFINITIONS::RESULT__RANGE_STATUS);
  results.stream_count = this->readReg(VL53L1X_DEFINITIONS::RESULT__STREAM_COUNT);
  results.dss_actual_effective_spads_sd0 = this->readReg16Bit(VL53L1X_DEFINITIONS::RESULT__DSS_ACTUAL_EFFECTIVE_SPADS_SD0);
  results.ambient_count_rate_mcps_sd0 = this->readReg16Bit(VL53L1X_DEFINITIONS::RESULT__AMBIENT_COUNT_RATE_MCPS_SD0);
  results.final_crosstalk_corrected_range_mm_sd0 = this->readReg16Bit(VL53L1X_DEFINITIONS::RESULT__FINAL_CROSSTALK_CORRECTED_RANGE_MM_SD0);
  results.peak_signal_count_rate_crosstalk_corrected_mcps_sd0 = this->readReg16Bit(VL53L1X_DEFINITIONS::RESULT__PEAK_SIGNAL_COUNT_RATE_CROSSTALK_CORRECTED_MCPS_SD0);
}